

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElHCurl.cpp
# Opt level: O3

void __thiscall
TPZCompElHCurl<pzshape::TPZShapeLinear>::SideShapeFunction
          (TPZCompElHCurl<pzshape::TPZShapeLinear> *this,int side,TPZVec<double> *point,
          TPZFMatrix<double> *phi,TPZFMatrix<double> *curlphi)

{
  REAL RVar1;
  TPZFMatrix<double> *phi_00;
  TPZFMatrix<double> *this_00;
  int iVar2;
  MElementType MVar3;
  undefined4 uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  TPZGeoEl *this_01;
  TPZGeoNode *pTVar8;
  int64_t size;
  long lVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  REAL detjac;
  TPZManVector<long,_2> ids;
  TPZManVector<int,_3> ordHCurl;
  TPZGeoElSide gelside;
  TPZShapeData shapedata;
  REAL local_3d80;
  long local_3d78;
  long local_3d70;
  TPZFMatrix<double> *local_3d68;
  TPZFMatrix<double> *local_3d60;
  TPZManVector<long,_2> local_3d58;
  TPZManVector<int,_3> local_3d28;
  TPZGeoElSide local_3cf8;
  TPZFMatrix<double> local_3ce0;
  TPZFMatrix<double> local_3c50;
  TPZFMatrix<double> local_3bc0;
  double local_3b30 [10];
  TPZFMatrix<double> local_3ae0;
  double local_3a50 [10];
  TPZFMatrix<double> local_3a00;
  double local_3970 [10];
  TPZShapeData local_3920;
  
  local_3d68 = phi;
  local_3d60 = curlphi;
  iVar2 = pztopology::TPZLine::SideDimension(side);
  MVar3 = pztopology::TPZLine::Type(side);
  uVar4 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeLinear>).
                                 super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                 super_TPZCompEl + 0x310))(this,side);
  (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeLinear>).
                         super_TPZInterpolatedElement.super_TPZInterpolationSpace.super_TPZCompEl +
              0xa8))(this,uVar4);
  iVar5 = pztopology::TPZLine::NContainedSides(side);
  uVar6 = pztopology::TPZLine::NSideNodes(side);
  local_3920._0_4_ = 0xffffffff;
  TPZManVector<int,_3>::TPZManVector(&local_3d28,(long)(int)(iVar5 - uVar6),(int *)&local_3920);
  if ((int)uVar6 < iVar5) {
    lVar9 = 0;
    do {
      iVar7 = pztopology::TPZLine::ContainedSideLocId(side,uVar6 + (int)lVar9);
      iVar7 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeLinear>).
                                     super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                     super_TPZCompEl + 0x338))(this,iVar7);
      local_3d28.super_TPZVec<int>.fStore[lVar9] = iVar7;
      lVar9 = lVar9 + 1;
    } while ((uVar6 - iVar5) + (int)lVar9 != 0);
  }
  local_3920._0_8_ = 0;
  TPZManVector<long,_2>::TPZManVector(&local_3d58,(long)(int)uVar6,(long *)&local_3920);
  this_01 = TPZCompEl::Reference((TPZCompEl *)this);
  if (0 < (int)uVar6) {
    uVar12 = 0;
    do {
      iVar5 = pztopology::TPZLine::ContainedSideLocId(side,(int)uVar12);
      pTVar8 = TPZGeoEl::NodePtr(this_01,iVar5);
      local_3d58.super_TPZVec<long>.fStore[uVar12] = (long)pTVar8->fId;
      uVar12 = uVar12 + 1;
    } while (uVar6 != uVar12);
  }
  TPZShapeData::TPZShapeData(&local_3920);
  if (MVar3 == EOned) {
    TPZShapeHCurl<pzshape::TPZShapeLinear>::Initialize
              (&local_3d58.super_TPZVec<long>,&local_3d28.super_TPZVec<int>,&local_3920);
    iVar5 = TPZShapeHCurl<pzshape::TPZShapeLinear>::NHCurlShapeF(&local_3920);
    lVar9 = 1;
  }
  else {
    if (MVar3 == ETriangle) {
      TPZShapeHCurl<pzshape::TPZShapeTriang>::Initialize
                (&local_3d58.super_TPZVec<long>,&local_3d28.super_TPZVec<int>,&local_3920);
      iVar5 = TPZShapeHCurl<pzshape::TPZShapeTriang>::NHCurlShapeF(&local_3920);
    }
    else {
      if (MVar3 != EQuadrilateral) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "virtual void TPZCompElHCurl<pzshape::TPZShapeLinear>::SideShapeFunction(int, TPZVec<REAL> &, TPZFMatrix<REAL> &, TPZFMatrix<REAL> &) [TSHAPE = pzshape::TPZShapeLinear]"
                   ,0xa7);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"\n invalid side type.Aborting...\n",0x20);
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/TPZCompElHCurl.cpp"
                   ,0x225);
      }
      TPZShapeHCurl<pzshape::TPZShapeQuad>::Initialize
                (&local_3d58.super_TPZVec<long>,&local_3d28.super_TPZVec<int>,&local_3920);
      iVar5 = TPZShapeHCurl<pzshape::TPZShapeQuad>::NHCurlShapeF(&local_3920);
    }
    lVar9 = 2;
  }
  local_3d78 = 1;
  lVar10 = (long)iVar5;
  local_3c50.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_3c50.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_3c50.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018151d8;
  local_3c50.fElem = (double *)0x0;
  local_3c50.fGiven = (double *)0x0;
  local_3c50.fSize = 0;
  local_3c50.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = lVar9;
  local_3c50.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = lVar10;
  TPZVec<int>::TPZVec(&local_3c50.fPivot.super_TPZVec<int>,0);
  local_3c50.fPivot.super_TPZVec<int>.fStore = local_3c50.fPivot.fExtAlloc;
  local_3c50.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_3c50.fPivot.super_TPZVec<int>.fNElements = 0;
  local_3c50.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_3c50.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_3c50.fWork.fStore = (double *)0x0;
  local_3c50.fWork.fNElements = 0;
  local_3c50.fWork.fNAlloc = 0;
  uVar12 = lVar9 * lVar10;
  local_3d70 = lVar10;
  if (uVar12 != 0) {
    uVar11 = 0xffffffffffffffff;
    if (uVar12 < 0x2000000000000000) {
      uVar11 = uVar12 * 8;
    }
    local_3c50.fElem = (double *)operator_new__(uVar11);
  }
  lVar10 = local_3d70;
  lVar9 = local_3d78;
  local_3ce0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = local_3d78;
  local_3ce0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = local_3d70;
  local_3ce0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_3ce0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_3ce0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_018151d8;
  local_3ce0.fElem = (double *)0x0;
  local_3ce0.fGiven = (double *)0x0;
  local_3ce0.fSize = 0;
  TPZVec<int>::TPZVec(&local_3ce0.fPivot.super_TPZVec<int>,0);
  local_3ce0.fPivot.super_TPZVec<int>.fStore = local_3ce0.fPivot.fExtAlloc;
  local_3ce0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_3ce0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_3ce0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_3ce0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_3ce0.fWork.fStore = (double *)0x0;
  local_3ce0.fWork.fNElements = 0;
  local_3ce0.fWork.fNAlloc = 0;
  uVar12 = lVar9 * lVar10;
  if (uVar12 != 0) {
    uVar11 = 0xffffffffffffffff;
    if (uVar12 < 0x2000000000000000) {
      uVar11 = uVar12 * 8;
    }
    local_3ce0.fElem = (double *)operator_new__(uVar11);
  }
  if (MVar3 == EOned) {
    TPZShapeHCurl<pzshape::TPZShapeLinear>::Shape(point,&local_3920,&local_3c50,&local_3ce0);
  }
  else if (MVar3 == ETriangle) {
    TPZShapeHCurl<pzshape::TPZShapeTriang>::Shape(point,&local_3920,&local_3c50,&local_3ce0);
  }
  else {
    if (MVar3 != EQuadrilateral) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "virtual void TPZCompElHCurl<pzshape::TPZShapeLinear>::SideShapeFunction(int, TPZVec<REAL> &, TPZFMatrix<REAL> &, TPZFMatrix<REAL> &) [TSHAPE = pzshape::TPZShapeLinear]"
                 ,0xa7);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"\n invalid side type.Aborting...\n",0x20);
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Mesh/TPZCompElHCurl.cpp"
                 ,0x23f);
    }
    TPZShapeHCurl<pzshape::TPZShapeQuad>::Shape(point,&local_3920,&local_3c50,&local_3ce0);
  }
  local_3cf8.fGeoEl = TPZCompEl::Reference((TPZCompEl *)this);
  local_3cf8.super_TPZSavable._vptr_TPZSavable = (_func_int **)&PTR__TPZGeoElSide_018f8760;
  lVar9 = (long)iVar2;
  local_3ae0.fElem = local_3a50;
  local_3ae0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_3ae0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_3ae0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_01816238;
  local_3ae0.fSize = 9;
  local_3cf8.fSide = side;
  local_3ae0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = lVar9;
  local_3ae0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = lVar9;
  local_3ae0.fGiven = local_3ae0.fElem;
  TPZVec<int>::TPZVec(&local_3ae0.fPivot.super_TPZVec<int>,0);
  local_3ae0.fPivot.super_TPZVec<int>.fStore = local_3ae0.fPivot.fExtAlloc;
  local_3ae0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_3ae0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_3ae0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_3ae0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_3ae0.fWork.fStore = (double *)0x0;
  local_3ae0.fWork.fNElements = 0;
  local_3ae0.fWork.fNAlloc = 0;
  uVar12 = lVar9 * lVar9;
  if (iVar2 == 0) {
    local_3ae0.fElem = (double *)0x0;
  }
  else if (9 < uVar12) {
    uVar11 = 0xffffffffffffffff;
    if (uVar12 < 0x2000000000000000) {
      uVar11 = uVar12 * 8;
    }
    local_3ae0.fElem = (double *)operator_new__(uVar11);
  }
  local_3ae0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_01815f48;
  local_3bc0.fElem = local_3b30;
  local_3bc0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_3bc0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_3bc0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_01816238;
  local_3bc0.fSize = 9;
  local_3bc0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = lVar9;
  local_3bc0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = lVar9;
  local_3bc0.fGiven = local_3bc0.fElem;
  TPZVec<int>::TPZVec(&local_3bc0.fPivot.super_TPZVec<int>,0);
  local_3bc0.fPivot.super_TPZVec<int>.fStore = local_3bc0.fPivot.fExtAlloc;
  local_3bc0.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_3bc0.fPivot.super_TPZVec<int>.fNElements = 0;
  local_3bc0.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_3bc0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_3bc0.fWork.fStore = (double *)0x0;
  local_3bc0.fWork.fNElements = 0;
  local_3bc0.fWork.fNAlloc = 0;
  if (iVar2 == 0) {
    local_3bc0.fElem = (double *)0x0;
  }
  else if (9 < uVar12) {
    uVar11 = 0xffffffffffffffff;
    if (uVar12 < 0x2000000000000000) {
      uVar11 = uVar12 * 8;
    }
    local_3bc0.fElem = (double *)operator_new__(uVar11);
  }
  local_3bc0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_01815f48;
  local_3a00.fElem = local_3970;
  local_3a00.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 3;
  local_3a00.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
  local_3a00.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
  local_3a00.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFMatrix_01816238;
  local_3a00.fSize = 9;
  local_3a00.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = lVar9;
  local_3a00.fGiven = local_3a00.fElem;
  TPZVec<int>::TPZVec(&local_3a00.fPivot.super_TPZVec<int>,0);
  local_3a00.fPivot.super_TPZVec<int>.fStore = local_3a00.fPivot.fExtAlloc;
  local_3a00.fPivot.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01815498;
  local_3a00.fPivot.super_TPZVec<int>.fNElements = 0;
  local_3a00.fPivot.super_TPZVec<int>.fNAlloc = 0;
  local_3a00.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813df0;
  local_3a00.fWork.fStore = (double *)0x0;
  local_3a00.fWork.fNElements = 0;
  local_3a00.fWork.fNAlloc = 0;
  if (iVar2 == 0) {
    local_3a00.fElem = (double *)0x0;
  }
  else if (3 < iVar2) {
    local_3a00.fElem = (double *)operator_new__(lVar9 * 0x18);
  }
  local_3a00.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
       (_func_int **)&PTR__TPZFNMatrix_01815f48;
  local_3d80 = 0.0;
  TPZGeoElSide::Jacobian(&local_3cf8,point,&local_3ae0,&local_3a00,&local_3d80,&local_3bc0);
  this_00 = local_3d60;
  phi_00 = local_3d68;
  lVar9 = local_3d70;
  (*(local_3d68->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xe]
  )(local_3d68,local_3d70,3);
  (*(this_00->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xe])
            (this_00,local_3d78,lVar9);
  TransformShape(&local_3c50,local_3d80,&local_3bc0,&local_3a00,phi_00);
  RVar1 = local_3d80;
  if (iVar2 == 1) {
    TPZFMatrix<double>::operator=(this_00,&local_3ce0);
  }
  else {
    if (iVar2 != 2) {
      if (iVar2 == 3) {
        TransformCurl<3>(&local_3ce0,local_3d80,&local_3ae0,this_00);
      }
      goto LAB_0120f293;
    }
    TPZFMatrix<double>::operator=(this_00,&local_3ce0);
  }
  (*(this_00->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0x26])
            (1.0 / RVar1,this_00);
LAB_0120f293:
  TPZFMatrix<double>::~TPZFMatrix(&local_3a00,&PTR_PTR_01816200);
  TPZFMatrix<double>::~TPZFMatrix(&local_3bc0,&PTR_PTR_01816200);
  TPZFMatrix<double>::~TPZFMatrix(&local_3ae0,&PTR_PTR_01816200);
  TPZFMatrix<double>::~TPZFMatrix(&local_3ce0);
  TPZFMatrix<double>::~TPZFMatrix(&local_3c50);
  TPZShapeData::~TPZShapeData(&local_3920,&TPZShapeData::VTT);
  if (local_3d58.super_TPZVec<long>.fStore != local_3d58.fExtAlloc) {
    local_3d58.super_TPZVec<long>.fNAlloc = 0;
    local_3d58.super_TPZVec<long>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813f30;
    if (local_3d58.super_TPZVec<long>.fStore != (long *)0x0) {
      operator_delete__(local_3d58.super_TPZVec<long>.fStore);
    }
  }
  if (local_3d28.super_TPZVec<int>.fStore != local_3d28.fExtAlloc) {
    local_3d28.super_TPZVec<int>.fNAlloc = 0;
    local_3d28.super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01813ef0;
    if (local_3d28.super_TPZVec<int>.fStore != (int *)0x0) {
      operator_delete__(local_3d28.super_TPZVec<int>.fStore);
    }
  }
  return;
}

Assistant:

void TPZCompElHCurl<TSHAPE>::SideShapeFunction(int side,TPZVec<REAL> &point,TPZFMatrix<REAL> &phi,TPZFMatrix<REAL> &curlphi)
{
    constexpr int dim = TSHAPE::Dimension;
    const int sideDim = TSHAPE::SideDimension(side);
    const MElementType sidetype = TSHAPE::Type(side);
#ifdef PZDEBUG
    if(side >= TSHAPE::NSides || side < TSHAPE::NCornerNodes){
        PZError<<__PRETTY_FUNCTION__<<"\n";
        PZError<<"There is no side shape associated to this side"<<"\n";
        DebugStop();
    }
	if( sideDim != point.size() ){
        PZError<<__PRETTY_FUNCTION__<<"\n";
        PZError<<"Wrong dimension of point! point dim: "<<point.size()<<"\tside dim: "<<sideDim<<"\n";
		return ;
	}
#endif

    const int connectLocalId = this->MidSideConnectLocId(side);
    const int connectOrder = this->Connect(connectLocalId).Order();
    const int nContainedSides = TSHAPE::NContainedSides(side);
    const int nSideNodes = TSHAPE::NSideNodes(side);
    const int nSideConnects = nContainedSides - nSideNodes;
    //vector with the connect order for each side of dim >=1 contained in side
    TPZManVector<int,TSHAPE::NSides> ordHCurl(nSideConnects,-1);
    for (auto is=nSideNodes; is< nContainedSides; is++) {
        const int subSide = TSHAPE::ContainedSideLocId(side,is);
        ordHCurl[is-nSideNodes] = this->EffectiveSideOrder(subSide);
    }
    
    TPZManVector<int64_t,TSHAPE::NCornerNodes> ids(nSideNodes,0);
    TPZGeoEl *ref = this->Reference();
    for (auto is=0; is< nSideNodes; is++) {
        const int subSide = TSHAPE::ContainedSideLocId(side,is);
        ids[is] = ref->NodePtr(subSide)->Id();
    }

    TPZShapeData shapedata;

    
    int sidedim{-1};
    int nshape{-1};
    switch(sidetype){
    case EOned:
        TPZShapeHCurl<pzshape::TPZShapeLinear>::Initialize(ids,ordHCurl,shapedata);
        nshape = TPZShapeHCurl<pzshape::TPZShapeLinear>::NHCurlShapeF(shapedata);
        sidedim = 1;
        break;
    case ETriangle:
        TPZShapeHCurl<pzshape::TPZShapeTriang>::Initialize(ids,ordHCurl,shapedata);
        nshape = TPZShapeHCurl<pzshape::TPZShapeTriang>::NHCurlShapeF(shapedata);
        sidedim = 2;
        break;
    case EQuadrilateral:
        TPZShapeHCurl<pzshape::TPZShapeQuad>::Initialize(ids,ordHCurl,shapedata);
        nshape = TPZShapeHCurl<pzshape::TPZShapeQuad>::NHCurlShapeF(shapedata);
        sidedim = 2;
        break;
    default:
        PZError<<__PRETTY_FUNCTION__
               <<"\n invalid side type.Aborting...\n";
        DebugStop();
    }

    const int curldim = [sidedim](){
        if (sidedim == 1) return 1;
        else{
            return 2*sidedim - 3;//1 for 2D 3 for 3D
        }
    }();
    
    TPZFMatrix<REAL> phiref(sidedim,nshape);
    TPZFMatrix<REAL> curlphiref(curldim,nshape);
    
    switch(sidetype){
    case EOned:
        TPZShapeHCurl<pzshape::TPZShapeLinear>::Shape(point, shapedata, phiref, curlphiref);
        break;
    case ETriangle:
        TPZShapeHCurl<pzshape::TPZShapeTriang>::Shape(point, shapedata, phiref, curlphiref);
        break;
    case EQuadrilateral:
        TPZShapeHCurl<pzshape::TPZShapeQuad>::Shape(point, shapedata, phiref, curlphiref);
        break;
    default:
        PZError<<__PRETTY_FUNCTION__
               <<"\n invalid side type.Aborting...\n";
        DebugStop();
    }

    //get the jacobian of the side transformation
    TPZGeoElSide gelside = TPZGeoElSide(this->Reference(),side);
    TPZFNMatrix<9,REAL> jac(sideDim,sideDim),jacinv(sideDim,sideDim),axes(sideDim,3);
    REAL detjac = 0;
    gelside.Jacobian(point, jac, axes, detjac, jacinv);


    phi.Redim(nshape,3);
    curlphi.Redim(curldim,nshape);
    
    TransformShape(phiref, detjac, jacinv, axes, phi);
    switch(sideDim){
    case 1:
        TransformCurl<1>(curlphiref, detjac, jac, curlphi);
        break;
    case 2:
        TransformCurl<2>(curlphiref, detjac, jac, curlphi);
        break;
    case 3:
        TransformCurl<3>(curlphiref, detjac, jac, curlphi);
        break;
    }
    
    
}